

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pdist.c
# Opt level: O0

double gammapdf(double x,double k,double th)

{
  double dVar1;
  double dVar2;
  double dVar3;
  double t;
  double oup;
  double th_local;
  double k_local;
  double x_local;
  
  if ((k <= 0.0) || (th <= 0.0)) {
    printf("Gamma Distribution parameters must be positive and real.");
    exit(1);
  }
  dVar1 = x / th;
  if (dVar1 <= 0.0) {
    if (0.0 <= dVar1) {
      if ((((dVar1 != 0.0) || (NAN(dVar1))) || (k != 1.0)) || (NAN(k))) {
        printf("The Output is Complex and cannot be determined");
        exit(1);
      }
      t = 1.0 / th;
    }
    else {
      t = 0.0;
    }
  }
  else {
    dVar2 = log(dVar1);
    dVar3 = gamma_log(k);
    dVar1 = exp(((k - 1.0) * dVar2 + -dVar1) - dVar3);
    t = dVar1 / th;
  }
  return t;
}

Assistant:

double gammapdf(double x, double k, double th) {
	double oup,t;
	/*
	 * Gamma pdf = x ^ (k-1) * exp( - k/th) / (gamma(k) * theta ^k)
	 * Define t = x /th
	 * pdf = exp ((k-1) *log(t) - t - gamma_log(k)) /th
	 */ 
	
	if (k <= 0. || th <= 0.) {
		printf("Gamma Distribution parameters must be positive and real.");
		exit(1);
	}
	
	t = x / th;
	
	if (t > 0.) {
		oup = exp ((k-1) *log(t) - t - gamma_log(k)) /th;
	} else if (t < 0.) {
		oup = 0.0;
	} else if (t == 0.0 && k == 1) {
		oup = 1.0 / th;
	} else {
		printf("The Output is Complex and cannot be determined");
		exit(1);
	}
	
	return oup;
}